

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract(data_view *data,DataType baseType,Time *val)

{
  long lVar1;
  TimeRepresentation<count_time<9,_long>_> TVar2;
  baseType bVar3;
  size_type sVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  double t;
  double extraout_XMM0_Qa;
  string_view timeString;
  string_view val_00;
  string_view val_01;
  allocator<char> local_59;
  NamedPoint point;
  size_t index;
  basic_string_view<char,_std::char_traits<char>_> stringData;
  
  switch(baseType) {
  case HELICS_DOUBLE:
    t = ValueConverter<double>::interpret(data);
    goto LAB_00236e57;
  case HELICS_INT:
  case HELICS_TIME:
    lVar1 = ValueConverter<long>::interpret(data);
    goto LAB_00236e5c;
  case HELICS_COMPLEX:
    ValueConverter<std::complex<double>_>::interpret(data);
    t = extraout_XMM0_Qa;
LAB_00236e57:
    lVar1 = count_time<9,_long>::convert(t);
LAB_00236e5c:
    val->internalTimeCode = lVar1;
    break;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)&point,data);
    if (point.name._M_dataplus._M_p == (pointer)point.name._M_string_length) {
      bVar3 = 0;
    }
    else {
      bVar3 = count_time<9,_long>::convert(*(double *)point.name._M_dataplus._M_p);
    }
    val->internalTimeCode = bVar3;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&point);
    break;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&point,data);
    if (point.name._M_dataplus._M_p == (pointer)point.name._M_string_length) {
      bVar3 = 0;
    }
    else {
      bVar3 = count_time<9,_long>::convert(*(double *)point.name._M_dataplus._M_p);
    }
    val->internalTimeCode = bVar3;
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&point)
    ;
    break;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret(&point,data);
    if (NAN(point.value)) {
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&point,
                   ".[eE",0);
      if (sVar4 != 0xffffffffffffffff) {
        val_01._M_str = point.name._M_dataplus._M_p;
        val_01._M_len = point.name._M_string_length;
        point.value = getDoubleFromString(val_01);
        goto LAB_00236e3b;
      }
      val_00._M_str = extraout_RDX_00;
      val_00._M_len = (size_t)point.name._M_dataplus._M_p;
      bVar3 = getIntFromString((helics *)point.name._M_string_length,val_00);
    }
    else {
LAB_00236e3b:
      bVar3 = count_time<9,_long>::convert(point.value);
    }
    val->internalTimeCode = bVar3;
    std::__cxx11::string::~string((string *)&point);
    break;
  default:
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)&point,(helics *)data,(data_view *)val);
      valueExtract((defV *)&point,val);
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)&point);
      return;
    }
  case HELICS_BOOL:
    stringData = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
                           (data);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&point,(basic_string_view<char,_std::char_traits<char>_> *)&stringData,
               &local_59);
    TVar2.internalTimeCode = std::__cxx11::stoll(&point.name,&index,10);
    std::__cxx11::string::~string((string *)&point);
    if ((index != 0xffffffffffffffff) && (index != stringData._M_len)) {
      timeString._M_str = extraout_RDX;
      timeString._M_len = (size_t)stringData._M_str;
      TVar2 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                        ((utilities *)stringData._M_len,timeString);
    }
    val->internalTimeCode = TVar2.internalTimeCode;
    return;
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, Time& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val = ValueConverter<double>::interpret(data);
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            val.setBaseTimeCode(ValueConverter<int64_t>::interpret(data));
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            size_t index;
            try {
                auto stringData = ValueConverter<std::string_view>::interpret(data);
                auto timeCode = std::stoll(std::string(stringData), &index);
                if ((index == std::string::npos) || (index == stringData.size())) {
                    val.setBaseTimeCode(timeCode);
                } else {
                    val = gmlc::utilities::loadTimeFromString<helics::Time>(stringData);
                }
            }
            catch (...) {
                val = timeZero;
            }

            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            val = (!vec.empty()) ? Time(vec[0]) : timeZero;
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val = cval.real();
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val = (!cvec.empty()) ? Time(cvec[0].real()) : timeZero;
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto point = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(point.value)) {
                if (point.name.find(".[eE") == std::string::npos) {
                    const std::int64_t intVal = getIntFromString(point.name);
                    val.setBaseTimeCode(intVal);
                } else {
                    val = getDoubleFromString(point.name);
                }
            } else {
                val = point.value;
            }
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}